

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O3

void IoTHubMessaging_LL_SendMessageComplete
               (void *context,MESSAGE_SEND_RESULT send_result,AMQP_VALUE delivery_state)

{
  if (context != (void *)0x0) {
    if (*(code **)((long)context + 0x10) != (code *)0x0) {
      (**(code **)((long)context + 0x10))
                (*(undefined8 *)((long)context + 0x18),(send_result != MESSAGE_SEND_OK) * '\x02');
    }
    dequeue_send_callback_data((SEND_CALLBACK_DATA *)context);
    return;
  }
  return;
}

Assistant:

static void IoTHubMessaging_LL_SendMessageComplete(void* context, MESSAGE_SEND_RESULT send_result, AMQP_VALUE delivery_state)
{
    (void)delivery_state;
    if (context != NULL)
    {
        SEND_CALLBACK_DATA* send_data = (SEND_CALLBACK_DATA*)context;

        if (send_data->callback != NULL)
        {
            // Convert a MESSAGE_SEND_RESULT to an IOTHUB_MESSAGING_RESULT.
            IOTHUB_MESSAGING_RESULT msg_result;
            switch (send_result)
            {
                case MESSAGE_SEND_OK:
                    msg_result = IOTHUB_MESSAGING_OK;
                    break;
                case MESSAGE_SEND_ERROR:
                case MESSAGE_SEND_TIMEOUT:
                case MESSAGE_SEND_CANCELLED:
                default:
                    msg_result = IOTHUB_MESSAGING_ERROR;
                    break;
            }

            send_data->callback(send_data->userContext, msg_result);
        }

        dequeue_send_callback_data(send_data);
    }
}